

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

unsigned_long_long __thiscall
chaiscript::Boxed_Number::get_as<unsigned_long_long>(Boxed_Number *this)

{
  float fVar1;
  double dVar2;
  longdouble lVar3;
  Common_Types CVar4;
  ulong uVar5;
  unsigned_long_long uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  longdouble lVar9;
  longdouble lVar10;
  
  CVar4 = get_common_type(&this->bv);
  switch(CVar4) {
  case t_int32:
    uVar6 = (unsigned_long_long)
            *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_double:
    dVar2 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    uVar8 = (ulong)dVar2;
    uVar5 = (ulong)(dVar2 - 9.223372036854776e+18);
    goto LAB_00340830;
  case t_uint8:
    uVar6 = (unsigned_long_long)
            *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_int8:
    uVar6 = (unsigned_long_long)
            *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_uint16:
    uVar6 = (unsigned_long_long)
            *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_int16:
    uVar6 = (unsigned_long_long)
            *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_uint32:
    uVar6 = (unsigned_long_long)
            *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_uint64:
  case t_int64:
    uVar6 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_float:
    fVar1 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    uVar8 = (ulong)fVar1;
    uVar5 = (ulong)(fVar1 - 9.223372e+18);
LAB_00340830:
    uVar6 = uVar5 & (long)uVar8 >> 0x3f | uVar8;
    break;
  case t_long_double:
    lVar3 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    lVar9 = (longdouble)9.223372e+18;
    lVar10 = (longdouble)0;
    if (lVar9 <= lVar3) {
      lVar10 = lVar9;
    }
    uVar6 = (ulong)(lVar9 <= lVar3) << 0x3f ^ (long)ROUND(lVar3 - lVar10);
    break;
  default:
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__bad_cast_00453578;
    __cxa_throw(puVar7,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  return uVar6;
}

Assistant:

Target get_as() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          return get_as_aux<Target, int32_t>(bv);
        case Common_Types::t_uint8:
          return get_as_aux<Target, uint8_t>(bv);
        case Common_Types::t_int8:
          return get_as_aux<Target, int8_t>(bv);
        case Common_Types::t_uint16:
          return get_as_aux<Target, uint16_t>(bv);
        case Common_Types::t_int16:
          return get_as_aux<Target, int16_t>(bv);
        case Common_Types::t_uint32:
          return get_as_aux<Target, uint32_t>(bv);
        case Common_Types::t_uint64:
          return get_as_aux<Target, uint64_t>(bv);
        case Common_Types::t_int64:
          return get_as_aux<Target, int64_t>(bv);
        case Common_Types::t_double:
          return get_as_aux<Target, double>(bv);
        case Common_Types::t_float:
          return get_as_aux<Target, float>(bv);
        case Common_Types::t_long_double:
          return get_as_aux<Target, long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }